

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hpp
# Opt level: O3

CaseResult * __thiscall
rc::detail::CaseResultHelper<void>::resultOf<void(*)()>
          (CaseResult *__return_storage_ptr__,CaseResultHelper<void> *this,_func_void **callable)

{
  string local_38;
  
  (**(code **)this)();
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"no exceptions thrown","");
  CaseResult::CaseResult(__return_storage_ptr__,Success,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static CaseResult resultOf(const Callable &callable, Args &&... args) {
    callable(std::forward<Args>(args)...);
    return CaseResult(CaseResult::Type::Success, "no exceptions thrown");
  }